

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void Free(void *ptr)

{
  MemInfo *pMVar1;
  MemInfo *pMVar2;
  MemInfo *__ptr;
  
  __ptr = (MemInfo *)((long)ptr + -0x18);
  pMVar1 = *(MemInfo **)((long)ptr + -0x18);
  if (MallocKey == __ptr) {
    MallocKey = pMVar1;
    if (pMVar1 != (MemInfo *)0x0) {
      pMVar1->next = (MemInfo *)0x0;
      free(__ptr);
      return;
    }
  }
  else {
    pMVar2 = *(MemInfo **)((long)ptr + -0x10);
    if (pMVar1 != (MemInfo *)0x0) {
      pMVar1->next = pMVar2;
    }
    if (pMVar2 != (MemInfo *)0x0) {
      pMVar2->prev = pMVar1;
      free(__ptr);
      return;
    }
  }
  free(__ptr);
  return;
}

Assistant:

void Free(void *ptr)
{
  struct MemInfo *point;
  /* `point' points to the MemInfo structure: */
  point=(struct MemInfo *)((char *)ptr-sizeof(struct MemInfo));

  if(MallocKey==point) {
    /* if this is the last Malloc, set `last' to `prev' */
    MallocKey=point->prev;
    if(MallocKey)
      MallocKey->next=NULL;
  } else {
    /* point the previous' `next' to our `next', and our next `previous'
       to our `previous'. Unlink us from the chain */
    if(point->prev)
      /* only if we aren't the _first_ Malloc() ! */
      point->prev->next=point->next;
    if(point->next)
      /* only if there is a next! */
      point->next->prev=point->prev;
  }
#ifdef DEBUG
  mem-=point->size+sizeof(struct MemInfo);

  CheckMem(ptr);
#endif

#ifdef AMIGA  
  FreeMem(point, point->size+sizeof(struct MemInfo));
#elif unix
  free(point);
#endif
}